

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NonMaximumSuppression::MergeFrom
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  double dVar1;
  void *pvVar2;
  string *psVar3;
  string *psVar4;
  LogMessage *other;
  NonMaximumSuppression_PickTop *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  StringVector *from_00;
  Int64Vector *from_01;
  NonMaximumSuppression_PickTop *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NonMaximumSuppression.pb.cc"
               ,0x353);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  psVar3 = (from->confidenceinputfeaturename_).ptr_;
  if ((psVar3->_M_string_length != 0) &&
     (psVar4 = (this->confidenceinputfeaturename_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->confidenceinputfeaturename_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->coordinatesinputfeaturename_).ptr_;
  if ((psVar3->_M_string_length != 0) &&
     (psVar4 = (this->coordinatesinputfeaturename_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->coordinatesinputfeaturename_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->iouthresholdinputfeaturename_).ptr_;
  if ((psVar3->_M_string_length != 0) &&
     (psVar4 = (this->iouthresholdinputfeaturename_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->iouthresholdinputfeaturename_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->confidencethresholdinputfeaturename_).ptr_;
  if ((psVar3->_M_string_length != 0) &&
     (psVar4 = (this->confidencethresholdinputfeaturename_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->confidencethresholdinputfeaturename_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->confidenceoutputfeaturename_).ptr_;
  if ((psVar3->_M_string_length != 0) &&
     (psVar4 = (this->confidenceoutputfeaturename_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->confidenceoutputfeaturename_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  psVar3 = (from->coordinatesoutputfeaturename_).ptr_;
  if ((psVar3->_M_string_length != 0) &&
     (psVar4 = (this->coordinatesoutputfeaturename_).ptr_, psVar4 != psVar3)) {
    if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->coordinatesoutputfeaturename_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
  }
  dVar1 = from->iouthreshold_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->iouthreshold_ = dVar1;
  }
  dVar1 = from->confidencethreshold_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->confidencethreshold_ = dVar1;
  }
  if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] == 1) {
      this_00 = (this->SuppressionMethod_).picktop_;
LAB_0026192b:
      from_02 = (from->SuppressionMethod_).picktop_;
    }
    else {
      this->_oneof_case_[0] = 1;
      this_00 = (NonMaximumSuppression_PickTop *)operator_new(0x18);
      NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(this_00);
      (this->SuppressionMethod_).picktop_ = this_00;
      if (from->_oneof_case_[0] == 1) goto LAB_0026192b;
      protobuf_NonMaximumSuppression_2eproto::InitDefaults();
      from_02 = (NonMaximumSuppression_PickTop *)&_NonMaximumSuppression_PickTop_default_instance_;
    }
    NonMaximumSuppression_PickTop::MergeFrom(this_00,from_02);
  }
  if (from->_oneof_case_[1] != 0x65) {
    if (from->_oneof_case_[1] != 100) {
      return;
    }
    if (this->_oneof_case_[1] == 100) {
      this_01 = (this->ClassLabels_).stringclasslabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[1] = 100;
      this_01 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(this_01);
      (this->ClassLabels_).stringclasslabels_ = this_01;
      if (from->_oneof_case_[1] != 100) {
        from_00 = StringVector::default_instance();
        goto LAB_002619e2;
      }
    }
    from_00 = (from->ClassLabels_).stringclasslabels_;
LAB_002619e2:
    StringVector::MergeFrom(this_01,from_00);
    return;
  }
  if (this->_oneof_case_[1] == 0x65) {
    this_02 = (this->ClassLabels_).int64classlabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 0x65;
    this_02 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_02);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[1] != 0x65) {
      from_01 = Int64Vector::default_instance();
      goto LAB_002619f4;
    }
  }
  from_01 = (from->ClassLabels_).int64classlabels_;
LAB_002619f4:
  Int64Vector::MergeFrom(this_02,from_01);
  return;
}

Assistant:

void NonMaximumSuppression::MergeFrom(const NonMaximumSuppression& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NonMaximumSuppression)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.confidenceinputfeaturename().size() > 0) {

    confidenceinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceinputfeaturename_);
  }
  if (from.coordinatesinputfeaturename().size() > 0) {

    coordinatesinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesinputfeaturename_);
  }
  if (from.iouthresholdinputfeaturename().size() > 0) {

    iouthresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iouthresholdinputfeaturename_);
  }
  if (from.confidencethresholdinputfeaturename().size() > 0) {

    confidencethresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidencethresholdinputfeaturename_);
  }
  if (from.confidenceoutputfeaturename().size() > 0) {

    confidenceoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceoutputfeaturename_);
  }
  if (from.coordinatesoutputfeaturename().size() > 0) {

    coordinatesoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesoutputfeaturename_);
  }
  if (from.iouthreshold() != 0) {
    set_iouthreshold(from.iouthreshold());
  }
  if (from.confidencethreshold() != 0) {
    set_confidencethreshold(from.confidencethreshold());
  }
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from.picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}